

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

int __thiscall Board::place(Board *this,Block *block)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  
  lVar3 = (long)block->t;
  lVar5 = (long)block->o;
  lVar8 = 0;
  do {
    lVar4 = (long)blockShape[lVar3][lVar5][lVar8 * 2] + (long)block->x;
    lVar6 = (long)*(int *)(lVar5 * 0x20 + lVar3 * 0x80 + 0x11dd94 + lVar8 * 8) + (long)block->y;
    this->rows[lVar4] = this->rows[lVar4] | 1 << ((byte)lVar6 & 0x1f);
    this->cols[lVar6] = this->cols[lVar6] | 1 << ((byte)lVar4 & 0x1f);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  lVar8 = 0;
  iVar2 = 0;
  do {
    lVar4 = (long)blockShape[lVar3][lVar5][lVar8 * 2];
    uVar7 = 1;
    if (this->rows[lVar4 + block->x] != 0xfff) {
      lVar4 = lVar4 + (long)block->x + -1;
      lVar6 = lVar4 << 0x20;
      do {
        lVar9 = lVar6;
        if (lVar4 == 0) break;
        piVar1 = this->rows + lVar4;
        lVar6 = lVar9 + -0x100000000;
        lVar4 = lVar4 + -1;
      } while (*piVar1 == 0xfff);
      uVar7 = (uint)((*(uint *)((long)this->rows + (lVar9 >> 0x1e)) >>
                      (blockShape[lVar3][lVar5][lVar8 * 2 + 1] + block->y & 0x1fU) & 1) != 0);
    }
    iVar2 = iVar2 + uVar7;
    lVar8 = lVar8 + 1;
    if (lVar8 == 4) {
      return iVar2;
    }
  } while( true );
}

Assistant:

int Board::place(const Block &block){
    int i, tmpX, tmpY;
    auto shape = blockShape[block.t][block.o];
    for (i = 0; i < 4; ++i) {
        tmpX = block.x + shape[2 * i];
        tmpY = block.y + shape[2 * i + 1];
        rows[tmpX] |= 1 << tmpY;
        cols[tmpY] |= 1 << tmpX;
    }
    int basenum =0;
    for (i = 0; i < 4; ++i) {
        tmpX = block.x + shape[2 * i];
        tmpY = block.y + shape[2 * i + 1];
        bool base = rows[tmpX] == FULL_ROW;
        if (!base)
        {
            int t = tmpX - 1;
            while (t && rows[t] == FULL_ROW)
                --t;
            base = ((rows[t]>>tmpY)&1);
        }
        if (base)
            ++basenum;
    }
    return basenum;
}